

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O3

int xcb_input_hierarchy_change_data_serialize
              (void **_buffer,uint16_t type,xcb_input_hierarchy_change_data_t *_aux)

{
  ushort uVar1;
  uint uVar2;
  ulong *puVar3;
  void *__dest;
  int iVar4;
  int iVar5;
  undefined6 in_register_00000032;
  ulong uVar6;
  size_t __n;
  int iVar7;
  long in_FS_OFFSET;
  char xcb_pad0 [3];
  iovec xcb_parts [16];
  uint local_140;
  xcb_input_device_id_t local_13c;
  undefined1 local_13a;
  xcb_input_hierarchy_change_data_t *local_138;
  ulong local_130;
  xcb_input_device_id_t *local_128;
  ulong local_120;
  uint8_t *local_118;
  undefined8 local_110;
  xcb_input_device_id_t *local_108;
  ulong local_100;
  xcb_input_device_id_t *local_f8;
  ulong local_f0 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __dest = *_buffer;
  local_13a = 0;
  local_13c = 0;
  memset(&local_138,0xaa,0x100);
  iVar4 = 0;
  iVar5 = (int)CONCAT62(in_register_00000032,type);
  if (iVar5 - 1U < 4) {
    puVar3 = local_f0;
    switch(iVar5) {
    case 1:
      local_138 = _aux;
      local_130 = 2;
      local_128 = (xcb_input_device_id_t *)&(_aux->add_master).send_core;
      local_120 = 1;
      local_118 = &(_aux->add_master).enable;
      local_110 = 1;
      local_108 = (xcb_input_device_id_t *)(_aux->add_master).name;
      uVar1 = (_aux->add_master).name_len;
      local_100 = (ulong)uVar1;
      uVar2 = -(uint)uVar1 & 3;
      iVar5 = uVar1 + 4 + uVar2;
      if (uVar2 == 0) {
        iVar7 = 4;
        uVar2 = 3;
        goto LAB_0018b4f2;
      }
      local_f8 = &local_13c;
      uVar6 = (ulong)uVar2;
      iVar4 = 0;
      iVar7 = 5;
      uVar2 = 3;
      break;
    case 2:
      local_138 = (xcb_input_hierarchy_change_data_t *)&_aux->remove_master;
      uVar6 = 2;
      local_130 = 2;
      local_128 = (xcb_input_device_id_t *)&(_aux->remove_master).return_mode;
      local_120 = 1;
      local_118 = (uint8_t *)&local_140;
      local_110 = 1;
      local_108 = &(_aux->remove_master).return_pointer;
      local_100 = 2;
      local_f8 = &(_aux->remove_master).return_keyboard;
      iVar4 = 8;
      iVar7 = 5;
      uVar2 = 1;
      iVar5 = 0;
      break;
    case 3:
      puVar3 = &local_120;
      local_138 = (xcb_input_hierarchy_change_data_t *)&_aux->attach_slave;
      local_130 = 2;
      local_128 = &(_aux->attach_slave).master;
      iVar4 = 4;
      iVar7 = 2;
      uVar2 = 1;
      iVar5 = 0;
      uVar6 = 2;
      break;
    case 4:
      puVar3 = &local_120;
      local_138 = (xcb_input_hierarchy_change_data_t *)&_aux->detach_slave;
      local_130 = 2;
      local_128 = &local_13c;
      iVar4 = 4;
      iVar7 = 2;
      iVar5 = 0;
      uVar6 = 2;
      uVar2 = 0;
    }
    local_130 = 2;
    *puVar3 = uVar6;
  }
  else {
    uVar2 = 0xffffffff;
    iVar5 = 0;
    iVar7 = 0;
    iVar4 = 0;
  }
LAB_0018b4f2:
  uVar2 = -iVar4 & uVar2;
  local_140 = uVar2;
  if (uVar2 != 0) {
    *(xcb_input_device_id_t **)((long)&local_138 + (ulong)(uint)(iVar7 << 4)) = &local_13c;
    *(ulong *)((long)&local_130 + (ulong)(uint)(iVar7 << 4)) = (ulong)uVar2;
    iVar7 = iVar7 + 1;
    local_140 = 0;
  }
  uVar2 = iVar5 + iVar4 + uVar2;
  if (__dest == (void *)0x0) {
    __dest = malloc((ulong)uVar2);
    *_buffer = __dest;
  }
  if (iVar7 != 0) {
    uVar6 = 0;
    do {
      __n = *(size_t *)((long)&local_130 + uVar6);
      if (*(void **)((long)&local_138 + uVar6) != (void *)0x0) {
        if (__n == 0) {
          __n = 0;
        }
        else {
          memcpy(__dest,*(void **)((long)&local_138 + uVar6),__n);
        }
      }
      __dest = (void *)((long)__dest + __n);
      uVar6 = uVar6 + 0x10;
    } while ((uint)(iVar7 << 4) != uVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

int
xcb_input_hierarchy_change_data_serialize (void                                    **_buffer,
                                           uint16_t                                  type,
                                           const xcb_input_hierarchy_change_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 0;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[16];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_ADD_MASTER) {
        /* xcb_input_hierarchy_change_data_t.add_master.name_len */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->add_master.name_len;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_hierarchy_change_data_t.add_master.send_core */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->add_master.send_core;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_hierarchy_change_data_t.add_master.enable */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->add_master.enable;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* name */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->add_master.name;
        xcb_block_len += _aux->add_master.name_len * sizeof(char);
        xcb_parts[xcb_parts_idx].iov_len = _aux->add_master.name_len * sizeof(char);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(char);
        xcb_align_to = 4;
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
    }
    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_REMOVE_MASTER) {
        /* xcb_input_hierarchy_change_data_t.remove_master.deviceid */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.deviceid;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.return_mode */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.return_mode;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.return_pointer */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.return_pointer;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.return_keyboard */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.return_keyboard;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
    }
    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_ATTACH_SLAVE) {
        /* xcb_input_hierarchy_change_data_t.attach_slave.deviceid */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->attach_slave.deviceid;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.attach_slave.master */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->attach_slave.master;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
    }
    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_DETACH_SLAVE) {
        /* xcb_input_hierarchy_change_data_t.detach_slave.deviceid */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->detach_slave.deviceid;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.detach_slave.pad2 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}